

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_String __thiscall
ON_Font::CleanFontName(ON_Font *this,wchar_t *dirty_font_name,ON_StringMapOrdinalType map)

{
  wchar_t c;
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar4;
  ON_wString clean_font_name;
  ON_wString local_40;
  ON_wString local_38;
  wchar_t *pwVar3;
  
  ON_wString::ON_wString(&local_40,dirty_font_name);
  pwVar1 = ON_wString::Array(&local_40);
  pwVar2 = pwVar1;
  pwVar4 = pwVar1;
LAB_0048b209:
  pwVar3 = pwVar2 + 1;
  c = *pwVar2;
  pwVar2 = pwVar3;
  if ((uint)(c + L'\xffffffe0') < 0x40) goto code_r0x0048b219;
  goto LAB_0048b21f;
code_r0x0048b219:
  if ((0x8000000000002001U >> ((ulong)(uint)(c + L'\xffffffe0') & 0x3f) & 1) == 0) {
LAB_0048b21f:
    if (c == L'\0') {
      *pwVar4 = L'\0';
      ON_wString::SetLength(&local_40,(long)pwVar4 - (long)pwVar1 >> 2);
      if (map == Identity) {
        ON_String::ON_String((ON_String *)this,&local_40);
      }
      else {
        ON_wString::MapStringOrdinal(&local_38,(ON_StringMapOrdinalType)&local_40);
        ON_String::ON_String((ON_String *)this,&local_38);
        ON_wString::~ON_wString(&local_38);
      }
      ON_wString::~ON_wString(&local_40);
      return (ON_String)(char *)this;
    }
    if (map != Identity) {
      c = ON_wString::MapCharacterOrdinal(map,c);
    }
    *pwVar4 = c;
    pwVar4 = pwVar4 + 1;
  }
  goto LAB_0048b209;
}

Assistant:

const ON_String ON_Font::CleanFontName(
  const wchar_t* dirty_font_name,
  ON_StringMapOrdinalType map
)
{
  ON_wString clean_font_name(dirty_font_name);
  wchar_t* s0 = clean_font_name.Array();
  wchar_t* s1 = s0;
  const bool bMap = (ON_StringMapOrdinalType::Identity != map);
  for (wchar_t* s = s0, c = *s++; 0 != c; c = *s++)
  {
    if (
      ON_wString::Space == c
      || ON_wString::HyphenMinus == c
      || ON_wString::Underscore == c
      )
    {
      // PostScript, DWrite, LOGFONT all treat spaces, underbars and hyphens
      // differently. The purpose of this function is to get a string that
      // can be used to search for matching fonts. Ignoring spaces, underbars and hyphens
      // makes it possible to find installed fonts using a "dirty name" from another computer.
      continue;
    }
    if (bMap)
      c = ON_wString::MapCharacterOrdinal(map, c);
    *s1++ = c;
  }
  *s1 = 0;
  clean_font_name.SetLength(s1 - s0);
  if (map != ON_StringMapOrdinalType::Identity)
  {
    return clean_font_name.MapStringOrdinal(map);
  }
  return clean_font_name;
}